

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int hash_code(char *string)

{
  long lVar1;
  undefined8 local_20;
  unsigned_long h;
  unsigned_long c;
  char *string_local;
  
  local_20 = 0;
  c = (unsigned_long)string;
  while( true ) {
    lVar1 = (long)*(char *)c;
    if (lVar1 == 0) break;
    local_20 = (lVar1 + local_20) * 8 + (lVar1 + local_20 >> 2) + lVar1;
    c = c + 1;
  }
  return (int)(local_20 % 0xfd);
}

Assistant:

static int
hash_code (const char *string)
{
  unsigned long c, h = 0;
  
  while ((c = *string++))
    {
      h += c;
      h = (h << 3) + (h >> 2) + c;
    }

  return (h % HASH_BUCKETS);
}